

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_window.c
# Opt level: O2

void fft_pitch_shift(fft_window_data *data,void *user)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  void *__s;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  uint32_t k;
  ulong uVar8;
  void *__s_00;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  ulong uStack_a0;
  float afStack_98 [2];
  float *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  double local_68;
  double local_60;
  float local_58;
  float local_54;
  void *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_88 = data->framesize;
  local_80 = (ulong)(uint)data->oversampling;
  uVar7 = local_88 >> 1 & 0x7fffffff;
  pfVar3 = data->fft_workspace;
  pfVar4 = data->last_phase;
  local_90 = data->phase_sum;
  local_78 = local_88 & 0xffffffff;
  uVar5 = local_78 * 4 + 0xf & 0xfffffffffffffff0;
  local_40 = (double)((long)afStack_98 - uVar5);
  local_38 = (double)(((long)afStack_98 - uVar5) - uVar5);
  local_50 = (void *)((long)local_38 - uVar5);
  __s_00 = (void *)((long)local_50 - uVar5);
  local_68 = (double)data->samplerate / (double)local_78;
  local_60 = ((double)((local_88 & 0xffffffff) / local_80) * 6.283185307179586) / (double)local_78;
  local_54 = *user;
  local_58 = (float)local_80;
  local_70 = (ulong)((uint)uVar7 + 1);
  *(undefined8 *)((long)__s_00 + -8) = 0xffffffffffffffff;
  uVar5 = *(ulong *)((long)__s_00 + -8);
  while (uVar7 != uVar5) {
    fVar1 = pfVar3[uVar5 * 2 + 2];
    fVar2 = pfVar3[uVar5 * 2 + 3];
    auVar12._0_8_ = (double)(fVar1 * fVar1 + fVar2 * fVar2);
    auVar12._8_8_ = 0;
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    local_48 = (double)CONCAT44(local_48._4_4_,(float)(auVar12._0_8_ + auVar12._0_8_));
    *(undefined8 *)((long)__s_00 + -8) = 0x125d9f;
    dVar9 = atan2((double)fVar2,(double)fVar1);
    dVar11 = (double)(int)(uVar5 + 1);
    dVar10 = (double)(float)((double)((float)dVar9 - pfVar4[uVar5 + 1]) - dVar11 * local_60);
    uVar6 = (ulong)(dVar10 / 3.141592653589793);
    uVar8 = uVar6 & 0xfffffffffffffffe;
    if (-1 < (long)uVar6) {
      uVar8 = ((uint)uVar6 & 1) + uVar6;
    }
    pfVar4[uVar5 + 1] = (float)dVar9;
    *(undefined4 *)((long)local_38 + 4 + uVar5 * 4) = local_48._0_4_;
    *(float *)((long)local_40 + 4 + uVar5 * 4) =
         (float)(dVar11 * local_68 +
                local_68 *
                (double)(((float)((double)(long)uVar8 * -3.141592653589793 + dVar10) * local_58) /
                        6.2831855));
    uVar5 = uVar5 + 1;
  }
  __n = local_78 << 2;
  *(undefined8 *)((long)__s_00 + -8) = 0x125e70;
  memset(__s_00,0,__n);
  __s = local_50;
  *(undefined8 *)((long)__s_00 + -8) = 0x125e7e;
  memset(__s,0,__n);
  fVar1 = local_54;
  uVar5 = local_70;
  for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    uVar6 = (ulong)(fVar1 * (float)(int)uVar8);
    if ((uint)uVar6 <= (uint)uVar7) {
      uVar6 = uVar6 & 0xffffffff;
      *(float *)((long)__s_00 + uVar6 * 4) =
           *(float *)((long)local_38 + uVar8 * 4) + *(float *)((long)__s_00 + uVar6 * 4);
      *(float *)((long)local_50 + uVar6 * 4) = fVar1 * *(float *)((long)local_40 + uVar8 * 4);
    }
  }
  local_38 = (double)(local_80 & 0xffffffff);
  *(undefined8 *)((long)__s_00 + -8) = 0xffffffffffffffff;
  uVar5 = *(ulong *)((long)__s_00 + -8);
  while (uVar7 != uVar5) {
    dVar9 = (double)(int)(uVar5 + 1);
    fVar1 = (float)(dVar9 * local_60 +
                   (double)(float)(((double)(float)((double)(float)((double)*(float *)((long)
                                                  local_50 + uVar5 * 4 + 4) - dVar9 * local_68) /
                                                  local_68) * 6.283185307179586) / local_38)) +
            local_90[uVar5 + 1];
    local_48 = (double)*(float *)((long)__s_00 + uVar5 * 4 + 4);
    local_90[uVar5 + 1] = fVar1;
    dVar9 = (double)fVar1;
    local_40 = dVar9;
    *(undefined8 *)((long)__s_00 + -8) = 0x125f6e;
    dVar10 = cos(dVar9);
    dVar9 = local_40;
    pfVar3[uVar5 * 2 + 2] = (float)(dVar10 * local_48);
    *(undefined8 *)((long)__s_00 + -8) = 0x125f88;
    dVar9 = sin(dVar9);
    pfVar3[uVar5 * 2 + 3] = (float)(dVar9 * local_48);
    uVar5 = uVar5 + 1;
  }
  for (uVar5 = (ulong)((int)local_88 + 2); uVar5 < (uint)((int)local_88 * 2); uVar5 = uVar5 + 1) {
    pfVar3[uVar5] = 0.0;
  }
  return;
}

Assistant:

VECTORIZE void fft_pitch_shift(struct fft_window_data *data, void *user){
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  uint32_t framesize2 = framesize/2;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->last_phase;
  float *restrict phase_sum = data->phase_sum;
  float analyzed_frequency[framesize];
  float analyzed_magnitude[framesize];
  float synthesized_frequency[framesize];
  float synthesized_magnitude[framesize];

  uint32_t step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  float pitch_shift = *((float*)user);

  for(uint32_t k = 0; k <= framesize2; k++){
    float real = fft_workspace[2*k];
    float imag = fft_workspace[2*k+1];

    float magnitude = 2.*sqrt(real*real + imag*imag);
    float phase = atan2(imag,real);
    float tmp = phase - last_phase[k];
    last_phase[k] = phase;
    tmp -= (double)k*expected;
    long qpd = tmp/M_PI;
    if (qpd >= 0) qpd += qpd&1;
    else qpd -= qpd&1;
    tmp -= M_PI*(double)qpd;
    tmp = oversampling*tmp/(2.*M_PI);
    tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

    analyzed_magnitude[k] = magnitude;
    analyzed_frequency[k] = tmp;
  }

  memset(synthesized_magnitude, 0, framesize*sizeof(float));
  memset(synthesized_frequency, 0, framesize*sizeof(float));
  for(uint32_t k = 0; k <= framesize2; k++){
    uint32_t index = k*pitch_shift;
    if(index <= framesize2){
      synthesized_magnitude[index] += analyzed_magnitude[k];
      synthesized_frequency[index] = analyzed_frequency[k] * pitch_shift;
    }
  }

  for(uint32_t k = 0; k <= framesize2; k++){
    float magnitude = synthesized_magnitude[k];
    float tmp = synthesized_frequency[k];

    tmp -= (double)k*bin_frequencies;
    tmp /= bin_frequencies;
    tmp = 2.*M_PI*tmp/oversampling;
    tmp += (double)k*expected;
    phase_sum[k] += tmp;

    float phase = phase_sum[k];
    fft_workspace[2*k] = magnitude*cos(phase);
    fft_workspace[2*k+1] = magnitude*sin(phase);
  }

  for(uint32_t k = framesize+2; k < 2*framesize; k++)
    fft_workspace[k] = 0.;
}